

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,double kappa,double delta,double theta,double obj_amp)

{
  solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>
  *reduced_cost;
  rc_data *prVar1;
  undefined1 auVar2 [16];
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar3;
  bool bVar4;
  uint r_size;
  int iVar5;
  int iVar6;
  _Head_base<0UL,_int_*,_false> _Var7;
  long lVar8;
  __uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
  _Var9;
  rc_data *ret_1;
  rc_data *prVar10;
  rc_data *prVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  rc_data *ret;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 local_70 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_60;
  double local_58;
  unique_ptr<baryonyx::sparse_matrix<int>::row_value[],_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_50;
  double local_48;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_40;
  undefined8 local_38;
  
  if (first._M_current == last._M_current) {
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
  }
  else {
    local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 0x10);
    reduced_cost = this + 0x60;
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    local_58 = theta;
    local_50._M_t.
    super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>,_true,_true>
          )(__uniq_ptr_data<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>,_true,_true>
            )kappa;
    local_48 = delta;
    local_40._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )obj_amp;
    do {
      k = (first._M_current)->first;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_70,
                 (int)local_60._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl);
      if (local_70._8_8_ != local_70._0_8_) {
        lVar8 = *(long *)(this + 0x50);
        _Var7._M_head_impl = (int *)local_70._8_8_;
        do {
          iVar5 = *_Var7._M_head_impl;
          _Var7._M_head_impl = _Var7._M_head_impl + 8;
          *(double *)(lVar8 + (long)iVar5 * 8) = local_58 * *(double *)(lVar8 + (long)iVar5 * 8);
        } while (_Var7._M_head_impl != (int *)local_70._0_8_);
      }
      r_size = solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                           *)this,(row_iterator)local_70._8_8_,(row_iterator)local_70._0_8_,x);
      auVar19._8_8_ = 0;
      auVar19._0_8_ =
           local_40._M_t.
           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl;
      if (r_size != 0) {
        lVar13 = 0;
        lVar8 = *(long *)(this + 0x60);
        lVar17 = *(long *)(*(long *)(this + 0x168) + 8);
        do {
          auVar18._8_8_ = 0;
          auVar18._0_8_ =
               *(ulong *)(lVar17 + (long)((row_iterator)
                                         (local_70._8_8_ + (long)*(int *)(lVar8 + 8 + lVar13) * 8))
                                         ->column * 8);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(lVar8 + lVar13);
          auVar2 = vfmadd213sd_fma(auVar18,auVar19,auVar2);
          *(long *)(lVar8 + lVar13) = auVar2._0_8_;
          lVar13 = lVar13 + 0x10;
        } while ((ulong)r_size << 4 != lVar13);
      }
      lVar8 = (long)k;
      switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar8)) {
      case 0:
        if (1 < (int)r_size) {
          lVar17 = (long)(int)r_size;
          prVar11 = *(rc_data **)(this + 0x60);
          plVar3 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar11 + lVar17;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar11,prVar1,(int)LZCOUNT(lVar17) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar11,prVar1);
          lVar17 = lVar17 * 0x10 + -0x10;
          prVar10 = prVar11;
          do {
            prVar10 = prVar10 + 1;
            if ((prVar11->value != prVar10->value) || (NAN(prVar11->value) || NAN(prVar10->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar11,prVar10,plVar3);
              prVar11 = prVar10;
            }
            lVar17 = lVar17 + -0x10;
          } while (lVar17 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar11,prVar1,plVar3);
        }
        iVar6 = *(int *)(*(long *)(this + 0x70) + lVar8 * 0xc);
        iVar12 = *(int *)(*(long *)(this + 0x70) + 4 + lVar8 * 0xc);
        goto LAB_0059ddc1;
      case 2:
        if (1 < (int)r_size) {
          lVar17 = (long)(int)r_size;
          prVar11 = *(rc_data **)(this + 0x60);
          plVar3 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar11 + lVar17;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar11,prVar1,(int)LZCOUNT(lVar17) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar11,prVar1);
          lVar17 = lVar17 * 0x10 + -0x10;
          prVar10 = prVar11;
          do {
            prVar10 = prVar10 + 1;
            if ((prVar11->value != prVar10->value) || (NAN(prVar11->value) || NAN(prVar10->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar11,prVar10,plVar3);
              prVar11 = prVar10;
            }
            lVar17 = lVar17 + -0x10;
          } while (lVar17 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar11,prVar1,plVar3);
        }
        iVar6 = *(int *)(*(long *)(this + 0x70) + lVar8 * 0xc);
        iVar12 = *(int *)(*(long *)(this + 0x70) + 4 + lVar8 * 0xc);
        if (-1 < (int)r_size) {
          iVar5 = -2;
          lVar8 = -1;
          iVar15 = 0;
          do {
            iVar14 = (int)lVar8;
            if (iVar12 < iVar15) {
              iVar14 = iVar5;
            }
            if (iVar15 < iVar6) {
              iVar14 = iVar5;
            }
            iVar5 = iVar14;
            if (iVar5 == -2) {
              if (lVar8 + 1U == (ulong)r_size) break;
            }
            else if ((0.0 < *(double *)
                             ((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>,_true,_true>
                                      *)reduced_cost + 0x10 + lVar8 * 0x10)) ||
                    (lVar8 + 1U == (ulong)r_size)) goto LAB_0059ddc9;
            lVar8 = lVar8 + 1;
            iVar15 = iVar15 + *(int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 0xc + lVar8 * 0x10);
          } while( true );
        }
LAB_0059ddc1:
        iVar5 = branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::
                solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[]>>>
                          ((branch_and_bound_solver<baryonyx::itm::minimize_tag,double> *)
                           (this + 0x80),
                           (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                            *)reduced_cost,r_size,iVar6,iVar12);
        break;
      case 3:
        if (1 < (int)r_size) {
          lVar17 = (long)(int)r_size;
          prVar11 = *(rc_data **)(this + 0x60);
          plVar3 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar11 + lVar17;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar11,prVar1,(int)LZCOUNT(lVar17) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar11,prVar1);
          lVar17 = lVar17 * 0x10 + -0x10;
          prVar10 = prVar11;
          do {
            prVar10 = prVar10 + 1;
            if ((prVar11->value != prVar10->value) || (NAN(prVar11->value) || NAN(prVar10->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar11,prVar10,plVar3);
              prVar11 = prVar10;
            }
            lVar17 = lVar17 + -0x10;
          } while (lVar17 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar11,prVar1,plVar3);
        }
        if (-1 < (int)r_size) {
          lVar17 = -1;
          iVar12 = 0;
          iVar6 = -2;
          do {
            iVar5 = (int)lVar17;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar8 * 0xc) < iVar12) {
              iVar5 = iVar6;
            }
            if (iVar12 < *(int *)(*(long *)(this + 0x70) + lVar8 * 0xc)) {
              iVar5 = iVar6;
            }
            if (iVar5 == -2) {
              if (lVar17 + 1U == (ulong)r_size) break;
            }
            else if ((0.0 < *(double *)
                             ((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>,_true,_true>
                                      *)reduced_cost + 0x10 + lVar17 * 0x10)) ||
                    (lVar17 + 1U == (ulong)r_size)) goto LAB_0059ddc9;
            lVar17 = lVar17 + 1;
            iVar12 = iVar12 + *(int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 0xc + lVar17 * 0x10);
            iVar6 = iVar5;
          } while( true );
        }
      case 1:
        iVar5 = exhaustive_solver<baryonyx::itm::minimize_tag,double>::
                solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data[]>>>
                          ((exhaustive_solver<baryonyx::itm::minimize_tag,double> *)(this + 0xf0),k,
                           (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                            *)reduced_cost,r_size);
        break;
      default:
        if (1 < (int)r_size) {
          lVar17 = (long)(int)r_size;
          prVar11 = *(rc_data **)(this + 0x60);
          plVar3 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar11 + lVar17;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar11,prVar1,(int)LZCOUNT(lVar17) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar11,prVar1);
          lVar17 = lVar17 * 0x10 + -0x10;
          prVar10 = prVar11;
          do {
            prVar10 = prVar10 + 1;
            if ((prVar11->value != prVar10->value) || (NAN(prVar11->value) || NAN(prVar10->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar11,prVar10,plVar3);
              prVar11 = prVar10;
            }
            lVar17 = lVar17 + -0x10;
          } while (lVar17 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar11,prVar1,plVar3);
        }
        if ((int)r_size < 0) {
          iVar5 = -2;
        }
        else {
          uVar16 = 0xffffffffffffffff;
          iVar12 = 0;
          _Var9._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                 *)reduced_cost;
          iVar6 = -2;
          do {
            iVar5 = (int)uVar16;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar8 * 0xc) < iVar12) {
              iVar5 = iVar6;
            }
            if (iVar12 < *(int *)(*(long *)(this + 0x70) + lVar8 * 0xc)) {
              iVar5 = iVar6;
            }
            if ((iVar5 != -2) &&
               (0.0 < *(double *)
                       _Var9._M_t.
                       super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                       .
                       super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                       ._M_head_impl)) break;
            iVar12 = iVar12 + *(int *)((long)_Var9._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                                             ._M_head_impl + 0xc);
            uVar16 = uVar16 + 1;
            _Var9._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
            ._M_head_impl =
                 (tuple<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                  )((long)_Var9._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                          ._M_head_impl + 0x10);
            iVar6 = iVar5;
          } while (r_size != uVar16);
        }
      }
LAB_0059ddc9:
      bVar4 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                        (this,x,(row_value *)local_70._8_8_,k,iVar5,r_size,
                         (double)local_50._M_t.
                                 super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                 ._M_head_impl,local_48);
      first._M_current = first._M_current + 1;
      local_38._0_1_ = (byte)local_38 | bVar4;
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)local_38 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }